

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

IndirOpnd * __thiscall IR::IndirOpnd::CloneUseInternal(IndirOpnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  IndirOpnd *this_00;
  RegOpnd *local_48;
  RegOpnd *local_40;
  RegOpnd *newIndexOpnd;
  RegOpnd *newBaseOpnd;
  IndirOpnd *newOpnd;
  Func *func_local;
  IndirOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0xa42,"(m_kind == OpndKindIndir)","m_kind == OpndKindIndir");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->m_baseOpnd == (RegOpnd *)0x0) {
    local_40 = (RegOpnd *)0x0;
  }
  else {
    pOVar4 = Opnd::CloneUse(&this->m_baseOpnd->super_Opnd,func);
    local_40 = Opnd::AsRegOpnd(pOVar4);
  }
  if (this->m_indexOpnd == (RegOpnd *)0x0) {
    local_48 = (RegOpnd *)0x0;
  }
  else {
    pOVar4 = Opnd::CloneUse(&this->m_indexOpnd->super_Opnd,func);
    local_48 = Opnd::AsRegOpnd(pOVar4);
  }
  this_00 = New(local_40,local_48,this->m_scale,(this->super_Opnd).m_type,func);
  SetOffset(this_00,this->m_offset,(bool)((this->super_Opnd).field_0xe & 1));
  this_00->m_addrKind = this->m_addrKind;
  this_00->m_originalAddress = this->m_originalAddress;
  return this_00;
}

Assistant:

IndirOpnd *
IndirOpnd::CloneUseInternal(Func *func)
{
    Assert(m_kind == OpndKindIndir);
    IndirOpnd * newOpnd;

    RegOpnd * newBaseOpnd = m_baseOpnd ? m_baseOpnd->CloneUse(func)->AsRegOpnd() : nullptr;
    RegOpnd * newIndexOpnd = m_indexOpnd ? m_indexOpnd->CloneUse(func)->AsRegOpnd() : nullptr;
    newOpnd = IndirOpnd::New(newBaseOpnd, newIndexOpnd, m_scale, m_type, func);

    newOpnd->SetOffset(m_offset, m_dontEncode);

#if DBG_DUMP
    newOpnd->m_addrKind = m_addrKind;
    newOpnd->m_originalAddress = m_originalAddress;
#endif
    return newOpnd;
}